

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_noncentral_absolute_pose.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar13;
  timeval tVar14;
  timeval tic;
  timeval toc;
  size_t numberPoints;
  transformations_t gp3p_transformations;
  vector<int,_std::allocator<int>_> camCorrespondences;
  points_t points;
  bearingVectors_t bearingVectors;
  transformations_t upnp_transformations;
  rotations_t camRotations;
  translations_t camOffsets;
  translation_t position;
  vector<int,_std::allocator<int>_> indices10;
  translation_t t_perturbed;
  vector<int,_std::allocator<int>_> indices6;
  MatrixXd gt;
  NoncentralAbsoluteAdapter adapter;
  rotation_t rotation;
  rotation_t R_perturbed;
  transformation_t nonlinear_transformation_10;
  transformation_t gpnp_transformation_6;
  transformation_t nonlinear_transformation;
  transformation_t gpnp_transformation;
  timeval local_4f8;
  timeval local_4e8;
  unsigned_long local_4d8;
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_4d0;
  _Vector_base<int,_std::allocator<int>_> local_4b0;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_490;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_470;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_430;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_410;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_3f0;
  Vector3d local_3d8;
  _Vector_base<int,_std::allocator<int>_> local_3c0;
  translation_t local_3a8;
  _Vector_base<int,_std::allocator<int>_> local_390;
  void *local_378 [3];
  NoncentralAbsoluteAdapter local_360;
  Matrix3d local_2d0;
  rotation_t local_288;
  transformation_t local_240;
  transformation_t local_1e0;
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_180 [5];
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_100 [8];
  
  opengv::initializeRandomSeed();
  local_4d8 = 100;
  opengv::generateRandomTranslation(&local_3d8,2.0);
  opengv::generateRandomRotation(&local_2d0,0.5);
  local_3f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_410._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_410._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateRandomCameraSystem(4,(translations_t *)&local_3f0,(rotations_t *)&local_410);
  local_470._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_490._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_470._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_470._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_490._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_490._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360.super_AbsoluteAdapterBase._vptr_AbsoluteAdapterBase._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_378,(int *)&local_360,&local_4d8);
  opengv::generateRandom2D3DCorrespondences
            (&local_3d8,&local_2d0,(translations_t *)&local_3f0,(rotations_t *)&local_410,local_4d8,
             0.0,0.0,(bearingVectors_t *)&local_470,(points_t *)&local_490,
             (vector<int,_std::allocator<int>_> *)&local_4b0,(MatrixXd *)local_378);
  opengv::printExperimentCharacteristics(&local_3d8,&local_2d0,0.0,0.0);
  opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter
            (&local_360,(bearingVectors_t *)&local_470,(camCorrespondences_t *)&local_4b0,
             (points_t *)&local_490,(translations_t *)&local_3f0,(rotations_t *)&local_410,
             &local_2d0);
  std::operator<<((ostream *)&std::cout,"running Kneip\'s GP3P (using first three correspondences/")
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_4d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_4f8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::gp3p
              ((transformations_t *)local_100,&local_360.super_AbsoluteAdapterBase,0,1,2);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                      *)&local_4d0);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~_Vector_base(local_100);
  }
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  tVar13 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  tVar14 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  poVar1 = std::operator<<((ostream *)&std::cout,"running gpnp over all correspondences");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar5._0_8_ = (double)tVar13.tv_sec;
  auVar5._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = (double)tVar14.tv_usec;
  auVar9._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar9,auVar5,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_438 = auVar5._0_8_ / 50.0;
  gettimeofday(&local_4f8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::gpnp(&local_1e0,&local_360.super_AbsoluteAdapterBase);
  }
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  tVar13 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  tVar14 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  poVar1 = std::operator<<((ostream *)&std::cout,"running gpnp over 6 correspondences");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_390,6);
  opengv::absolute_pose::gpnp
            (&local_1e0,&local_360.super_AbsoluteAdapterBase,
             (vector<int,_std::allocator<int>_> *)&local_390);
  poVar1 = std::operator<<((ostream *)&std::cout,"running upnp over all correspondences");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar6._0_8_ = (double)tVar13.tv_sec;
  auVar6._8_8_ = in_XMM2_Qb;
  local_430._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar10._0_8_ = (double)tVar14.tv_usec;
  auVar10._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar10,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_440 = auVar5._0_8_ / 50.0;
  local_430._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_430._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_4f8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::upnp((transformations_t *)local_180,&local_360.super_AbsoluteAdapterBase)
    ;
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                      *)&local_430);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~_Vector_base(local_180);
  }
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  tVar13 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  tVar14 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getPerturbedPose(&local_3d8,&local_2d0,&local_3a8,&local_288,0.1);
  auVar7._0_8_ = (double)tVar13.tv_sec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = (double)tVar14.tv_usec;
  auVar11._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar11,auVar7,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_448 = auVar5._0_8_ / 50.0;
  gettimeofday(&local_4f8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_360.super_AbsoluteAdapterBase._t,&local_3a8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (&local_360.super_AbsoluteAdapterBase._R,&local_288);
    opengv::absolute_pose::optimize_nonlinear(&local_240,&local_360.super_AbsoluteAdapterBase);
  }
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  tVar13 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  tVar14 = timeval_minus((timeval *)&local_4e8,(timeval *)&local_4f8);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  std::operator<<((ostream *)&std::cout,"performing nonlinear optimization with 10 correspondences")
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_3c0,10);
  opengv::getPerturbedPose(&local_3d8,&local_2d0,&local_3a8,&local_288,0.1);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_360.super_AbsoluteAdapterBase._t,&local_3a8);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_360.super_AbsoluteAdapterBase._R,&local_288);
  opengv::absolute_pose::optimize_nonlinear
            (&local_240,&local_360.super_AbsoluteAdapterBase,
             (vector<int,_std::allocator<int>_> *)&local_3c0);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from gp3p algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar8._0_8_ = (double)tVar13.tv_sec;
  auVar8._8_8_ = in_XMM2_Qb;
  lVar2 = 0;
  auVar12._0_8_ = (double)tVar14.tv_usec;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar12,auVar8,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_450 = auVar5._0_8_ / 50.0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_4d0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_4d0._M_impl.super__Vector_impl_data._M_start) / 0x60);
      uVar3 = uVar3 + 1) {
    poVar1 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                               ((long)((local_4d0._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                                      m_storage.m_data.array + lVar2));
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x60;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from gpnp algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_100);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"results from gpnp algorithm with only 6 correspondences:");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_1e0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from upnp algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_430._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_430._M_impl.super__Vector_impl_data._M_start) / 0x60);
      uVar3 = uVar3 + 1) {
    poVar1 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                               ((long)((local_430._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                                      m_storage.m_data.array + lVar2));
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x60;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nonlinear algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_180);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "results from nonlinear algorithm with only 10 correspondences:");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_240);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from gp3p algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_438);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from gpnp algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_440);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from upnp algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_448);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from nonlinear algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_450);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3c0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~_Vector_base(&local_430);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_390);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~_Vector_base(&local_4d0);
  opengv::absolute_pose::NoncentralAbsoluteAdapter::~NoncentralAbsoluteAdapter(&local_360);
  Eigen::internal::handmade_aligned_free(local_378[0]);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4b0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_490);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_470);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_410);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_3f0);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 100;
  int numberCameras = 4;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);
  
  //create a random camera-system
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );
  
  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors;
  points_t points;
  std::vector<int> camCorrespondences;
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D3DCorrespondences(
      position, rotation, camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors, points, camCorrespondences, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a non-central absolute adapter
  absolute_pose::NoncentralAbsoluteAdapter adapter(
      bearingVectors,
      camCorrespondences,
      points,
      camOffsets,
      camRotations,
      rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //run the experiments
  std::cout << "running Kneip's GP3P (using first three correspondences/";
  std::cout << std::endl;
  transformations_t gp3p_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    gp3p_transformations = absolute_pose::gp3p(adapter);
  gettimeofday( &toc, 0 );
  double gp3p_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running gpnp over all correspondences" << std::endl;
  transformation_t gpnp_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    gpnp_transformation = absolute_pose::gpnp(adapter);
  gettimeofday( &toc, 0 );
  double gpnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running gpnp over 6 correspondences" << std::endl;
  std::vector<int> indices6 = getNindices(6);
  transformation_t gpnp_transformation_6 =
      absolute_pose::gpnp(adapter,indices6);
  
  std::cout << "running upnp over all correspondences" << std::endl;
  transformations_t upnp_transformations;
  gettimeofday( &tic, 0 );
  for( size_t i = 0; i < iterations; i++ )
    upnp_transformations = absolute_pose::upnp(adapter);
  gettimeofday( &toc, 0);
  double upnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;
  
  //std::cout << "running upnp over 6 correspondences" << std::endl;
  //transformations_t upnp_transformations_6 =
  //    absolute_pose::upnp(adapter,indices6);

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  //add a small perturbation to the rotation
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett(t_perturbed);
    adapter.setR(R_perturbed);
    nonlinear_transformation = absolute_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with 10 correspondences";
  std::cout << std::endl;
  std::vector<int> indices10 = getNindices(10);
  //add a small perturbation to the rotation
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  adapter.sett(t_perturbed);
  adapter.setR(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      absolute_pose::optimize_nonlinear(adapter,indices10);

  //print the results
  std::cout << "results from gp3p algorithm:" << std::endl;
  for(size_t i = 0; i < gp3p_transformations.size(); i++)
    std::cout << gp3p_transformations[i] << std::endl << std::endl;
  std::cout << "results from gpnp algorithm:" << std::endl;
  std::cout << gpnp_transformation << std::endl << std::endl;
  std::cout << "results from gpnp algorithm with only 6 correspondences:";
  std::cout << std::endl;
  std::cout << gpnp_transformation_6 << std::endl << std::endl;
  std::cout << "results from upnp algorithm:" << std::endl;
  for(size_t i = 0; i < upnp_transformations.size(); i++)
    std::cout << upnp_transformations[i] << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only 10 correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from gp3p algorithm: ";
  std::cout << gp3p_time << std::endl;
  std::cout << "timings from gpnp algorithm: ";
  std::cout << gpnp_time << std::endl;
  std::cout << "timings from upnp algorithm: ";
  std::cout << upnp_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}